

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

bool __thiscall TPZFMatrix<long>::Compare(TPZFMatrix<long> *this,TPZSavable *copy,bool override)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  stringstream sout;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (copy != (TPZSavable *)0x0) {
    lVar2 = __dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (lVar2 == 0) {
      return false;
    }
    bVar1 = TPZMatrix<long>::Compare(&this->super_TPZMatrix<long>,copy,false);
    lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      bVar1 = (bool)(bVar1 & this->fElem[lVar5] == *(long *)(*(long *)(lVar2 + 0x20) + lVar5 * 8));
    }
    if (bVar1 != false) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,
                             "virtual bool TPZFMatrix<long>::Compare(TPZSavable *, bool) const [TVar = long]"
                            );
    std::operator<<(poVar3," did not compare ");
    poVar3 = std::operator<<(local_1a8," number different terms ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," number terms ");
    std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(local_1a8," difference in norm L1 ");
    std::ostream::_M_insert<long>((long)poVar3);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&std::cout,asStack_1d8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string(asStack_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
                 ,0x903);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        DebugStop();
    }
    return matresult;
}